

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_lights::~xr_scene_lights(xr_scene_lights *this)

{
  ~xr_scene_lights(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

void xr_scene_lights::load(xr_reader& r)
{
	uint16_t version;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_SUN)) {
		r.r_u8();
		r.r_fvector2(m_sun);
		r.debug_find_chunk();
	}

	uint32_t count = 0;
	r.r_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_COUNT, count);
	if (r.find_chunk(LIGHTS_CHUNK_COMMON_CONTROLS)) {
		xr_assert(count == m_controls.size());
		for (xr_token_vec_it it = m_controls.begin(), end = m_controls.end();
				it != end; ++it) {
			const char* name = r.skip_sz();
			xr_assert(name == it->name);
			it->id = r.r_u32();
		}
		r.debug_find_chunk();
	}
}